

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O1

void __thiscall leveldb::log::Reader::ReportCorruption(Reader *this,uint64_t bytes,char *reason)

{
  Reporter *pRVar1;
  long in_FS_OFFSET;
  Slice local_70;
  Slice local_60;
  Status local_50;
  long *local_48;
  size_t sStack_40;
  long local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.data_ = reason;
  local_60.size_ = strlen(reason);
  (*this->file_->_vptr_SequentialFile[4])(&local_48);
  local_70.data_ = (char *)local_48;
  local_70.size_ = sStack_40;
  Status::Status(&local_50,kCorruption,&local_60,&local_70);
  pRVar1 = this->reporter_;
  if ((pRVar1 != (Reporter *)0x0) &&
     (this->initial_offset_ <= this->end_of_buffer_offset_ - ((this->buffer_).size_ + bytes))) {
    (*pRVar1->_vptr_Reporter[2])(pRVar1,bytes,&local_50);
  }
  if (local_50.state_ != (char *)0x0) {
    operator_delete__(local_50.state_);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Reader::ReportCorruption(uint64_t bytes, const char* reason) {
  ReportDrop(bytes, Status::Corruption(reason, file_->GetName()));
}